

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O1

int arkode_butcher_order6q
              (sunrealtype *b,sunrealtype **A1,sunrealtype **A2,sunrealtype *c1,sunrealtype **A3,
              sunrealtype *c2,int s)

{
  int iVar1;
  sunrealtype *b_00;
  sunrealtype *x;
  ulong uVar2;
  double dVar3;
  
  b_00 = (sunrealtype *)calloc((long)s,8);
  x = (sunrealtype *)calloc((long)s,8);
  iVar1 = arkode_butcher_mv(A3,c2,s,b_00);
  if (iVar1 == 0) {
    if ((0 < s && x != (sunrealtype *)0x0) &&
        (b_00 != (sunrealtype *)0x0 && c1 != (sunrealtype *)0x0)) {
      uVar2 = 0;
      do {
        x[uVar2] = c1[uVar2] * b_00[uVar2];
        uVar2 = uVar2 + 1;
      } while ((uint)s != uVar2);
      if ((((0 < s && x != (sunrealtype *)0x0) &&
            (b_00 != (sunrealtype *)0x0 && c1 != (sunrealtype *)0x0)) &&
          (iVar1 = arkode_butcher_mv(A2,x,s,b_00), iVar1 == 0)) &&
         (iVar1 = arkode_butcher_mv(A1,b_00,s,x), iVar1 == 0)) {
        if ((b != (sunrealtype *)0x0 && x != (sunrealtype *)0x0) && 0 < s) {
          dVar3 = 0.0;
          uVar2 = 0;
          do {
            dVar3 = dVar3 + b[uVar2] * x[uVar2];
            uVar2 = uVar2 + 1;
          } while ((uint)s != uVar2);
          dVar3 = dVar3 + -0.004166666666666667;
        }
        else {
          dVar3 = NAN;
        }
        if ((b == (sunrealtype *)0x0 || x == (sunrealtype *)0x0) || 0 >= s) {
          return 0;
        }
        free(b_00);
        free(x);
        return (uint)(ABS(dVar3) <= 1.4901161193847656e-08);
      }
    }
  }
  free(b_00);
  free(x);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order6q(sunrealtype* b, sunrealtype** A1,
                                             sunrealtype** A2, sunrealtype* c1,
                                             sunrealtype** A3, sunrealtype* c2,
                                             int s)
{
  sunrealtype bAAcAc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_mv(A3, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c1, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A2, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A1, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp2, s, &bAAcAc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bAAcAc - SUN_RCONST(1.0) / SUN_RCONST(240.0)) > TOL) ? SUNFALSE
                                                                       : SUNTRUE;
}